

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

void test_deflate(Byte *compr,uLong comprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  uint extraout_EAX_04;
  uint extraout_EAX_05;
  int iVar3;
  int extraout_EAX_06;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char **ppcVar9;
  ulong *__s1;
  ulong *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  char *__s1_00;
  undefined8 unaff_RBP;
  undefined4 uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  ulong *puVar16;
  ulong *puVar17;
  char **unaff_R13;
  ulong **ppuVar18;
  uLong auStack_4d8 [2];
  undefined1 *puStack_4c8;
  char *pcStack_4c0;
  code *pcStack_4b8;
  ulong uStack_4b0;
  undefined4 uStack_4a8;
  undefined4 uStack_490;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  uLong uStack_450;
  char *pcStack_440;
  undefined1 *puStack_438;
  code *pcStack_430;
  char *pcStack_428;
  int iStack_420;
  undefined1 *puStack_410;
  undefined4 uStack_408;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  uLong uStack_3c8;
  ulong uStack_3b0;
  code *pcStack_3a8;
  ulong uStack_398;
  uint uStack_390;
  undefined4 uStack_378;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  char *pcStack_328;
  char *pcStack_320;
  ulong uStack_318;
  code *pcStack_310;
  char *pcStack_300;
  uint uStack_2f8;
  ulong uStack_2e8;
  undefined4 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  long lStack_290;
  ulong *puStack_288;
  ulong uStack_280;
  code *pcStack_278;
  ulong uStack_268;
  undefined4 uStack_260;
  undefined4 uStack_248;
  ulong uStack_240;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  ulong uStack_1f8;
  ulong *puStack_1f0;
  code *pcStack_1e0;
  ulong *puStack_1d8;
  uint uStack_1d0;
  ulong *puStack_1c0;
  uint uStack_1b8;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  char *pcStack_160;
  char **ppcStack_158;
  ulong uStack_150;
  code *pcStack_148;
  ulong uStack_140;
  undefined4 uStack_138;
  ulong uStack_130;
  undefined4 uStack_120;
  ulong uStack_118;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  uLong uStack_d0;
  char *pcStack_c8;
  size_t sStack_c0;
  Byte *pBStack_b8;
  code *pcStack_b0;
  char *local_a0;
  undefined4 local_98;
  size_t local_90;
  Byte *local_88;
  undefined4 local_80;
  ulong local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  pcStack_b0 = (code *)0x102ead;
  sVar4 = strlen(hello);
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uVar11 = 0xffffffff;
  uVar6 = 0x70;
  pcStack_b0 = (code *)0x102eda;
  iVar1 = deflateInit_(&local_a0,0xffffffff,"1.2.8");
  if (iVar1 == 0) {
    sVar4 = sVar4 + 1;
    unaff_R13 = &local_a0;
    local_a0 = hello;
    unaff_RBP = 1;
    local_88 = compr;
    do {
      if ((local_90 == sVar4) || (comprLen <= local_78)) goto LAB_00102f22;
      local_80 = 1;
      local_98 = 1;
      pcStack_b0 = (code *)0x102f17;
      iVar1 = deflate(unaff_R13,0);
    } while (iVar1 == 0);
    pcStack_b0 = (code *)0x102f22;
    test_deflate_cold_4();
LAB_00102f22:
    do {
      local_80 = 1;
      uVar11 = 4;
      pcStack_b0 = (code *)0x102f38;
      iVar1 = deflate();
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      pcStack_b0 = (code *)0x102f65;
      test_deflate_cold_3();
      goto LAB_00102f65;
    }
    pcStack_b0 = (code *)0x102f4b;
    uVar2 = deflateEnd(&local_a0);
    if (uVar2 == 0) {
      return;
    }
  }
  else {
LAB_00102f65:
    pcStack_b0 = (code *)0x102f6c;
    test_deflate_cold_1();
    uVar2 = extraout_EAX;
  }
  uVar13 = (ulong)uVar2;
  pcStack_b0 = test_inflate;
  test_deflate_cold_2();
  pcStack_c8 = hello;
  *__s1 = 0x65676162726167;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_138 = 0;
  pcVar12 = "1.2.8";
  pcStack_148 = (code *)0x102fc9;
  uVar7 = uVar6;
  uStack_140 = uVar13;
  uStack_d0 = comprLen;
  sStack_c0 = sVar4;
  pBStack_b8 = compr;
  pcStack_b0 = (code *)unaff_RBP;
  iVar1 = inflateInit_(&uStack_140,"1.2.8",0x70);
  puVar17 = (ulong *)hello;
  if (iVar1 == 0) {
    unaff_RBP = 1;
    do {
      if ((uVar6 <= uStack_118) || (uVar11 <= uStack_130)) goto LAB_00102ffe;
      uStack_120 = 1;
      uStack_138 = 1;
      pcVar12 = (char *)0x0;
      pcStack_148 = (code *)0x102ff5;
      iVar1 = inflate(&uStack_140);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      pcStack_148 = (code *)0x103042;
      test_inflate_cold_4();
      puVar17 = &uStack_140;
      goto LAB_00103042;
    }
LAB_00102ffe:
    pcStack_148 = (code *)0x103006;
    uVar2 = inflateEnd(&uStack_140);
    puVar17 = &uStack_140;
    if (uVar2 != 0) goto LAB_00103049;
    pcVar12 = hello;
    pcStack_148 = (code *)0x103019;
    puVar16 = __s1;
    iVar1 = strcmp((char *)__s1,hello);
    puVar17 = &uStack_140;
    if (iVar1 == 0) {
      pcStack_148 = (code *)0x10302e;
      printf("inflate(): %s\n",__s1);
      return;
    }
  }
  else {
LAB_00103042:
    pcStack_148 = (code *)0x103049;
    test_inflate_cold_1();
    uVar2 = extraout_EAX_00;
LAB_00103049:
    puVar16 = (ulong *)(ulong)uVar2;
    pcStack_148 = (code *)0x103050;
    test_inflate_cold_2();
  }
  pcStack_148 = test_large_deflate;
  test_inflate_cold_3();
  ppuVar18 = &puStack_1d8;
  uStack_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uVar13 = 1;
  lVar8 = 0x70;
  pcStack_1e0 = (code *)0x103096;
  pcStack_160 = (char *)puVar17;
  ppcStack_158 = unaff_R13;
  uStack_150 = uVar6;
  pcStack_148 = (code *)uVar11;
  iVar1 = deflateInit_(&puStack_1d8,1,"1.2.8");
  if (iVar1 == 0) {
    uVar13 = 0;
    pcStack_1e0 = (code *)0x1030b6;
    puStack_1d8 = extraout_RDX;
    uStack_1d0 = (uint)uVar7;
    puStack_1c0 = puVar16;
    uStack_1b8 = (uint)pcVar12;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_0010314e;
    if (uStack_1d0 != 0) goto LAB_00103155;
    pcStack_1e0 = (code *)0x1030d8;
    deflateParams(&puStack_1d8,0,0);
    uStack_1d0 = (uint)pcVar12 >> 1;
    pcVar12 = (char *)(ulong)uStack_1d0;
    uVar13 = 0;
    pcStack_1e0 = (code *)0x1030ed;
    puStack_1d8 = puVar16;
    iVar1 = deflate(&puStack_1d8);
    if (iVar1 != 0) goto LAB_0010315a;
    pcStack_1e0 = (code *)0x103106;
    deflateParams(&puStack_1d8,9,1);
    uVar13 = 0;
    pcStack_1e0 = (code *)0x103117;
    puStack_1d8 = extraout_RDX;
    uStack_1d0 = (uint)uVar7;
    iVar1 = deflate(&puStack_1d8);
    if (iVar1 != 0) goto LAB_00103161;
    uVar13 = 4;
    pcStack_1e0 = (code *)0x103128;
    iVar1 = deflate(&puStack_1d8);
    ppuVar18 = &puStack_1d8;
    if (iVar1 != 1) goto LAB_00103168;
    pcStack_1e0 = (code *)0x103135;
    uVar2 = deflateEnd(&puStack_1d8);
    ppuVar18 = &puStack_1d8;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_1e0 = (code *)0x10314e;
    test_large_deflate_cold_1();
LAB_0010314e:
    pcStack_1e0 = (code *)0x103155;
    test_large_deflate_cold_2();
LAB_00103155:
    pcStack_1e0 = (code *)0x10315a;
    test_large_deflate_cold_3();
LAB_0010315a:
    ppuVar18 = (ulong **)pcVar12;
    pcStack_1e0 = (code *)0x103161;
    test_large_deflate_cold_4();
LAB_00103161:
    pcStack_1e0 = (code *)0x103168;
    test_large_deflate_cold_5();
LAB_00103168:
    pcStack_1e0 = (code *)0x10316d;
    test_large_deflate_cold_6();
    uVar2 = extraout_EAX_01;
  }
  uVar6 = (ulong)uVar2;
  pcStack_1e0 = test_large_inflate;
  test_large_deflate_cold_7();
  *extraout_RDX_00 = 0x65676162726167;
  uStack_228 = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  uStack_260 = (undefined4)uVar13;
  pcVar12 = "1.2.8";
  pcStack_278 = (code *)0x1031c4;
  uStack_268 = uVar6;
  uStack_1f8 = uVar7;
  puStack_1f0 = puVar16;
  pcStack_1e0 = (code *)ppuVar18;
  iVar1 = inflateInit_(&uStack_268,"1.2.8",0x70);
  if (iVar1 == 0) {
    puVar16 = &uStack_268;
    do {
      uStack_248 = (undefined4)lVar8;
      pcVar12 = (char *)0x0;
      pcStack_278 = (code *)0x1031e0;
      iVar1 = inflate(puVar16);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      pcStack_278 = (code *)0x103227;
      test_large_inflate_cold_4();
      goto LAB_00103227;
    }
    pcStack_278 = (code *)0x1031f3;
    uVar2 = inflateEnd(&uStack_268);
    if (uVar2 != 0) goto LAB_0010322e;
    uVar13 = uVar13 >> 1;
    uVar6 = uStack_240;
    if (uStack_240 == uVar13 + lVar8 * 2) {
      pcStack_278 = (code *)0x103214;
      puts("large_inflate(): OK");
      return;
    }
  }
  else {
LAB_00103227:
    pcStack_278 = (code *)0x10322e;
    test_large_inflate_cold_1();
    uVar2 = extraout_EAX_02;
LAB_0010322e:
    uVar6 = (ulong)uVar2;
    pcStack_278 = (code *)0x103235;
    test_large_inflate_cold_2();
  }
  pcStack_278 = test_flush;
  test_large_inflate_cold_3();
  pcStack_310 = (code *)0x10325a;
  lStack_290 = lVar8;
  puStack_288 = puVar16;
  uStack_280 = uVar13;
  sVar4 = strlen(hello);
  uStack_2c0 = 0;
  uStack_2b8 = 0;
  uStack_2b0 = 0;
  uVar11 = 0xffffffff;
  ppcVar9 = (char **)0x70;
  pcStack_310 = (code *)0x103287;
  iVar1 = deflateInit_(&pcStack_300,0xffffffff,"1.2.8");
  if (iVar1 == 0) {
    pcStack_300 = hello;
    uStack_2f8 = 3;
    uStack_2e0 = *(undefined4 *)pcVar12;
    uVar11 = 3;
    pcStack_310 = (code *)0x1032ad;
    uStack_2e8 = uVar6;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_001032fa;
    *(char *)(uVar6 + 3) = *(char *)(uVar6 + 3) + '\x01';
    uStack_2f8 = (int)sVar4 - 2;
    sVar4 = (size_t)uStack_2f8;
    uVar11 = 4;
    pcStack_310 = (code *)0x1032cc;
    uVar2 = deflate();
    if (1 < uVar2) goto LAB_00103301;
    pcStack_310 = (code *)0x1032db;
    uVar2 = deflateEnd(&pcStack_300);
    if (uVar2 == 0) {
      *(undefined8 *)pcVar12 = uStack_2d8;
      return;
    }
  }
  else {
    pcStack_310 = (code *)0x1032fa;
    test_flush_cold_1();
LAB_001032fa:
    pcStack_310 = (code *)0x103301;
    test_flush_cold_2();
LAB_00103301:
    pcStack_310 = (code *)0x103308;
    test_flush_cold_4();
    uVar2 = extraout_EAX_03;
  }
  uVar7 = (ulong)uVar2;
  pcStack_310 = test_sync;
  test_flush_cold_3();
  pcStack_320 = hello;
  *extraout_RDX_01 = 0x65676162726167;
  uStack_358 = 0;
  uStack_350 = 0;
  uStack_348 = 0;
  uStack_390 = 2;
  pcVar14 = "1.2.8";
  pcStack_3a8 = (code *)0x103362;
  uStack_398 = uVar7;
  pcStack_328 = pcVar12;
  uStack_318 = uVar6;
  pcStack_310 = (code *)sVar4;
  iVar1 = inflateInit_(&uStack_398,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_378 = SUB84(ppcVar9,0);
    pcVar14 = (char *)0x0;
    pcStack_3a8 = (code *)0x10337f;
    inflate(&uStack_398);
    uStack_390 = (int)uVar11 - 2;
    uVar11 = (ulong)uStack_390;
    pcStack_3a8 = (code *)0x103390;
    iVar1 = inflateSync(&uStack_398);
    if (iVar1 != 0) goto LAB_001033da;
    pcVar14 = (char *)0x4;
    pcStack_3a8 = (code *)0x1033a3;
    iVar1 = inflate(&uStack_398);
    if (iVar1 != -3) goto LAB_001033e1;
    pcStack_3a8 = (code *)0x1033b2;
    uVar2 = inflateEnd(&uStack_398);
    if (uVar2 == 0) {
      pcStack_3a8 = (code *)0x1033c7;
      printf("after inflateSync(): hel%s\n",extraout_RDX_01);
      return;
    }
  }
  else {
    pcStack_3a8 = (code *)0x1033da;
    test_sync_cold_1();
LAB_001033da:
    pcStack_3a8 = (code *)0x1033e1;
    test_sync_cold_2();
LAB_001033e1:
    pcStack_3a8 = (code *)0x1033e6;
    test_sync_cold_3();
    uVar2 = extraout_EAX_04;
  }
  puVar17 = (ulong *)(ulong)uVar2;
  pcStack_3a8 = test_dict_deflate;
  test_sync_cold_4();
  uStack_3e8 = 0;
  uStack_3e0 = 0;
  uStack_3d8 = 0;
  uVar10 = 9;
  pcVar12 = (char *)0x70;
  pcStack_430 = (code *)0x103424;
  uStack_3b0 = uVar11;
  pcStack_3a8 = (code *)ppcVar9;
  iVar1 = deflateInit_(&pcStack_428,9,"1.2.8");
  if (iVar1 == 0) {
    uVar10 = 0x104004;
    pcStack_430 = (code *)0x10343c;
    iVar1 = deflateSetDictionary(&pcStack_428,"hello",6);
    if (iVar1 != 0) goto LAB_0010349a;
    dictId = uStack_3c8;
    uStack_408 = SUB84(pcVar14,0);
    pcStack_428 = hello;
    pcStack_430 = (code *)0x103465;
    puStack_410 = (undefined1 *)puVar17;
    sVar4 = strlen(hello);
    iStack_420 = (int)sVar4 + 1;
    uVar10 = 4;
    pcStack_430 = (code *)0x103478;
    iVar1 = deflate(&pcStack_428);
    ppcVar9 = &pcStack_428;
    if (iVar1 != 1) goto LAB_001034a1;
    pcStack_430 = (code *)0x103485;
    uVar2 = deflateEnd(&pcStack_428);
    ppcVar9 = &pcStack_428;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_430 = (code *)0x10349a;
    test_dict_deflate_cold_1();
LAB_0010349a:
    pcStack_430 = (code *)0x1034a1;
    test_dict_deflate_cold_2();
LAB_001034a1:
    pcStack_430 = (code *)0x1034a6;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX_05;
  }
  uVar6 = (ulong)uVar2;
  pcStack_430 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1_00,"garbage",8);
  uStack_470 = 0;
  uStack_468 = 0;
  uStack_460 = 0;
  pcVar15 = "1.2.8";
  pcStack_4b8 = (code *)0x1034f5;
  uStack_4b0 = uVar6;
  uStack_4a8 = uVar10;
  pcStack_440 = pcVar14;
  puStack_438 = (undefined1 *)puVar17;
  pcStack_430 = (code *)ppcVar9;
  iVar1 = inflateInit_(&uStack_4b0,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_490 = SUB84(pcVar12,0);
    pcVar12 = "hello";
    do {
      pcVar15 = (char *)0x0;
      pcStack_4b8 = (code *)0x103519;
      iVar1 = inflate(&uStack_4b0);
      if (iVar1 == 2) {
        if (uStack_450 != dictId) {
          pcStack_4b8 = (code *)0x10358d;
          test_dict_inflate_cold_2();
          puVar17 = &uStack_4b0;
          goto LAB_0010358d;
        }
        pcVar15 = "hello";
        pcStack_4b8 = (code *)0x103543;
        iVar1 = inflateSetDictionary(&uStack_4b0,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_0010354e;
    } while (iVar1 == 0);
    pcStack_4b8 = (code *)0x10354e;
    test_dict_inflate_cold_5();
LAB_0010354e:
    pcStack_4b8 = (code *)0x103556;
    iVar1 = inflateEnd(&uStack_4b0);
    puVar17 = &uStack_4b0;
    if (iVar1 == 0) {
      pcVar15 = hello;
      pcStack_4b8 = (code *)0x103569;
      pcVar14 = __s1_00;
      iVar3 = strcmp(__s1_00,hello);
      iVar1 = (int)pcVar14;
      puVar17 = &uStack_4b0;
      if (iVar3 == 0) {
        pcStack_4b8 = (code *)0x10357e;
        printf("inflate with dictionary: %s\n",__s1_00);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    pcStack_4b8 = (code *)0x103594;
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_06;
  }
  pcStack_4b8 = (code *)0x10359b;
  test_dict_inflate_cold_3();
LAB_0010359b:
  pcStack_4b8 = main;
  test_dict_inflate_cold_4();
  auStack_4d8[0] = 40000;
  puStack_4c8 = (undefined1 *)puVar17;
  pcStack_4c0 = pcVar12;
  pcStack_4b8 = (code *)unaff_RBP;
  pcVar12 = (char *)zlibVersion();
  if (*pcVar12 == '1') {
    pcVar12 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar12,"1.2.8");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr,40000);
      if (iVar1 < 2) {
        pcVar12 = "foo.gz";
      }
      else {
        pcVar12 = *(char **)(pcVar15 + 8);
      }
      test_gzio(pcVar12,uncompr,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr,40000);
      test_large_deflate(compr_00,40000,uncompr,40000);
      test_large_inflate(compr_00,40000,uncompr,40000);
      test_flush(compr_00,auStack_4d8);
      test_sync(compr_00,auStack_4d8[0],uncompr,40000);
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr,40000);
      free(compr_00);
      free(uncompr);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_deflate(compr, comprLen)
    Byte *compr;
    uLong comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;
    uLong len = (uLong)strlen(hello)+1;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_DEFAULT_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;

    while (c_stream.total_in != len && c_stream.total_out < comprLen) {
        c_stream.avail_in = c_stream.avail_out = 1; /* force small buffers */
        err = deflate(&c_stream, Z_NO_FLUSH);
        CHECK_ERR(err, "deflate");
    }
    /* Finish the stream, still forcing small buffers: */
    for (;;) {
        c_stream.avail_out = 1;
        err = deflate(&c_stream, Z_FINISH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "deflate");
    }

    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}